

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Scl_Pair_t Scl_LibertyUpdateHead(Scl_Tree_t *p,Scl_Pair_t Head)

{
  char *pcVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  
  pcVar1 = p->pContents;
  pbVar3 = (byte *)0x0;
  pbVar4 = (byte *)0x0;
  for (pbVar6 = (byte *)(pcVar1 + Head.Beg); pbVar6 < pcVar1 + ((long)Head >> 0x20);
      pbVar6 = pbVar6 + 1) {
    bVar7 = *pbVar6;
    if (bVar7 == 10) {
      p->nLines = p->nLines + 1;
      bVar7 = *pbVar6;
    }
    if ((((0x20 < bVar7) || ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0)) && (bVar7 != 0x5c))
       && (pbVar4 = pbVar6, pbVar3 == (byte *)0x0)) {
      pbVar3 = pbVar6;
    }
  }
  uVar5 = (ulong)(((int)pbVar4 - (int)pcVar1) + 1);
  uVar2 = (int)pbVar3 - (int)pcVar1;
  if (pbVar4 == (byte *)0x0 || pbVar3 == (byte *)0x0) {
    uVar5 = (ulong)Head >> 0x20;
    uVar2 = Head.Beg;
  }
  return (Scl_Pair_t)((ulong)uVar2 | uVar5 << 0x20);
}

Assistant:

static inline Scl_Pair_t Scl_LibertyUpdateHead( Scl_Tree_t * p, Scl_Pair_t Head )
{
    Scl_Pair_t Res;
    char * pBeg = p->pContents + Head.Beg;
    char * pEnd = p->pContents + Head.End;
    char * pFirstNonSpace = NULL;
    char * pLastNonSpace = NULL;
    char * pChar;
    for ( pChar = pBeg; pChar < pEnd; pChar++ )
    {
        if ( *pChar == '\n' )
            p->nLines++;
        if ( Scl_LibertyCharIsSpace(*pChar) )
            continue;
        pLastNonSpace = pChar;
        if ( pFirstNonSpace == NULL )
            pFirstNonSpace = pChar;
    }
    if ( pFirstNonSpace == NULL || pLastNonSpace == NULL )
        return Head;
    assert( pFirstNonSpace && pLastNonSpace );
    Res.Beg = pFirstNonSpace - p->pContents;
    Res.End = pLastNonSpace  - p->pContents + 1;
    return Res;
}